

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::Message::_InternalParse(char_const*,google::protobuf::internal::ParseContext*)::ReflectiveFieldParser>
                 (ReflectiveFieldParser *field_parser,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  uint64 uVar7;
  uint uVar8;
  int iVar9;
  LogMessage *other;
  Message *pMVar10;
  undefined4 extraout_var;
  FieldDescriptor *pFVar11;
  UnknownFieldSet *pUVar12;
  string *psVar13;
  Descriptor *pDVar14;
  MessageLite *this;
  unsigned_long uVar15;
  ulong uVar16;
  unsigned_long extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  unsigned_long extraout_RDX_02;
  unsigned_long extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  unsigned_long extraout_RDX_07;
  unsigned_long extraout_RDX_08;
  unsigned_long extraout_RDX_09;
  unsigned_long extraout_RDX_10;
  char *pcVar17;
  uint64 *puVar18;
  ReflectiveFieldParser *pRVar19;
  uint64 *unaff_R12;
  uint32 uVar20;
  uint uVar21;
  uint64 value;
  bool bVar22;
  pair<const_char_*,_unsigned_int> pVar23;
  pair<const_char_*,_unsigned_long> pVar24;
  pair<const_char_*,_bool> pVar25;
  LogFinisher local_71;
  string *local_70;
  LogMessage local_68;
  byte *ptr_00;
  
  pVar24.second = (unsigned_long)ctx;
  pVar24.first = ptr;
  psVar13 = &field_parser->payload_;
  local_70 = psVar13;
  do {
    ptr_00 = (byte *)pVar24.first;
    if (ptr_00 < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar25._8_8_ = 0;
      pVar25.first = (char *)psVar13;
    }
    else {
      pVar25._9_7_ = pVar24.second._1_7_;
      pVar25.second = true;
      pVar25.first = (char *)(ptr_00 + -(long)(ctx->super_EpsCopyInputStream).buffer_end_);
      if (ptr_00 + -(long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (byte *)(long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar25 = EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,(char *)ptr_00,ctx->group_depth_);
        ptr_00 = (byte *)pVar25.first;
      }
    }
    uVar15 = pVar25._8_8_;
    if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)ptr_00;
    }
    bVar5 = *ptr_00;
    uVar21 = (uint)bVar5;
    puVar18 = (uint64 *)(ptr_00 + 1);
    if ((char)bVar5 < '\0') {
      uVar21 = ((uint)bVar5 + (uint)(byte)*puVar18 * 0x80) - 0x80;
      if ((char)(byte)*puVar18 < '\0') {
        pVar23 = ReadTagFallback((char *)ptr_00,uVar21);
        uVar15 = pVar23._8_8_;
        puVar18 = (uint64 *)pVar23.first;
        uVar21 = pVar23.second;
      }
      else {
        puVar18 = (uint64 *)(ptr_00 + 2);
      }
    }
    pVar24.second = uVar15;
    pVar24.first = (char *)puVar18;
    if (puVar18 == (uint64 *)0x0) {
      unaff_R12 = (uint64 *)0x0;
      psVar13 = (string *)0x0;
      goto LAB_0029d5c0;
    }
    uVar8 = uVar21 & 7;
    uVar16 = CONCAT71((int7)(uVar15 >> 8),uVar8 != 4);
    pVar24.second = uVar16;
    if (uVar21 == 0 || uVar8 == 4) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar21 - 1;
      psVar13 = (string *)0x0;
      unaff_R12 = puVar18;
      goto LAB_0029d5c0;
    }
    if ((uVar21 < 8) || (5 < uVar8)) goto LAB_0029d5b4;
    uVar20 = uVar21 >> 3;
    switch(uVar8) {
    case 0:
      value = (uint64)(char)(byte)*puVar18;
      pVar24.first = (char *)((long)puVar18 + 1);
      if ((long)value < 0) {
        bVar5 = *(byte *)((long)puVar18 + 1);
        uVar21 = ((uint)(byte)*puVar18 + (uint)bVar5 * 0x80) - 0x80;
        if ((char)bVar5 < '\0') {
          pVar24 = VarintParseSlow64((char *)puVar18,uVar21);
          value = pVar24.second;
        }
        else {
          value = (uint64)uVar21;
          pVar24.second = (ulong)bVar5 << 7;
          pVar24.first = (char *)((long)puVar18 + 2);
        }
      }
      uVar16 = pVar24.second;
      puVar18 = (uint64 *)pVar24.first;
      if (puVar18 == (uint64 *)0x0) goto LAB_0029d5b4;
      if ((uVar20 == 2) && (field_parser->is_item_ != false)) {
        uVar20 = (uint32)value;
        if ((field_parser->payload_)._M_string_length == 0) {
          field_parser->type_id_ = uVar20;
        }
        else {
          pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar20,2);
          if ((pFVar11 == (FieldDescriptor *)0x0) ||
             (pDVar14 = FieldDescriptor::message_type(pFVar11), pDVar14 == (Descriptor *)0x0)) {
            pUVar12 = field_parser->unknown_;
            if (pUVar12 == (UnknownFieldSet *)0x0) {
              pUVar12 = Reflection::MutableUnknownFields
                                  (field_parser->reflection_,field_parser->msg_);
              field_parser->unknown_ = pUVar12;
            }
            psVar13 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar12,uVar20);
            std::__cxx11::string::swap((string *)psVar13);
            pVar24.second = extraout_RDX_09;
            pVar24.first = (char *)puVar18;
          }
          else {
            this = &Reflection::MutableMessage
                              (field_parser->reflection_,field_parser->msg_,pFVar11,
                               (MessageFactory *)0x0)->super_MessageLite;
            MessageLite::ParsePartialFromString(this,local_70);
            pVar24.second = extraout_RDX_07;
            pVar24.first = (char *)puVar18;
          }
        }
      }
      else {
        pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar20,0);
        if (pFVar11 != (FieldDescriptor *)0x0) goto LAB_0029d96c;
        pUVar12 = field_parser->unknown_;
        if (pUVar12 == (UnknownFieldSet *)0x0) {
          pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_);
          field_parser->unknown_ = pUVar12;
        }
        UnknownFieldSet::AddVarint(pUVar12,uVar20,value);
        pVar24.second = extraout_RDX_10;
        pVar24.first = (char *)puVar18;
      }
      break;
    case 1:
      value = *puVar18;
      puVar18 = puVar18 + 1;
      pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar20,1);
      if (pFVar11 == (FieldDescriptor *)0x0) {
        pUVar12 = field_parser->unknown_;
        if (pUVar12 == (UnknownFieldSet *)0x0) {
          pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_);
          field_parser->unknown_ = pUVar12;
        }
        UnknownFieldSet::AddFixed64(pUVar12,uVar20,value);
        pVar24.second = extraout_RDX_02;
        pVar24.first = (char *)puVar18;
      }
      else {
LAB_0029d96c:
        SetField(value,pFVar11,field_parser->msg_,field_parser->reflection_);
        pVar24.second = extraout_RDX_08;
        pVar24.first = (char *)puVar18;
      }
      break;
    case 2:
      if ((uVar20 == 3) && (field_parser->is_item_ != false)) {
        uVar20 = field_parser->type_id_;
        psVar13 = local_70;
        if (uVar20 != 0) {
          field_parser->type_id_ = 0;
          goto LAB_0029d671;
        }
      }
      else {
LAB_0029d671:
        pRVar19 = field_parser;
        pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar20,2);
        if (pFVar11 != (FieldDescriptor *)0x0) {
          pcVar17 = ParseLenDelim((int)pRVar19,pFVar11,field_parser->msg_,field_parser->reflection_,
                                  (char *)puVar18,ctx);
          uVar16 = extraout_RDX_00;
          goto LAB_0029d8d1;
        }
        pUVar12 = field_parser->unknown_;
        if (pUVar12 == (UnknownFieldSet *)0x0) {
          pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_);
          field_parser->unknown_ = pUVar12;
        }
        psVar13 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar12,uVar20);
      }
      pcVar17 = InlineGreedyStringParser(psVar13,(char *)puVar18,ctx);
      uVar16 = extraout_RDX_06;
      goto LAB_0029d8d1;
    case 3:
      if (((field_parser->is_item_ == false) && (uVar20 == 1)) &&
         (*(char *)(*(long *)(field_parser->descriptor_ + 0x20) + 0x48) != '\0')) {
        field_parser->is_item_ = true;
        iVar9 = ctx->depth_;
        ctx->depth_ = iVar9 + -1;
        if (iVar9 < 1) {
          pcVar17 = (char *)0x0;
        }
        else {
          ctx->group_depth_ = ctx->group_depth_ + 1;
          pcVar17 = WireFormatParser<google::protobuf::Message::_InternalParse(char_const*,google::protobuf::internal::ParseContext*)::ReflectiveFieldParser>
                              (field_parser,(char *)puVar18,ctx);
          uVar2 = ctx->depth_;
          uVar4 = ctx->group_depth_;
          ctx->depth_ = uVar2 + 1;
          ctx->group_depth_ = uVar4 + -1;
          uVar20 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          uVar16 = extraout_RDX_04;
          if (uVar20 != 0xb) {
            pcVar17 = (char *)0x0;
          }
        }
        field_parser->is_item_ = false;
        field_parser->type_id_ = 0;
      }
      else {
        pRVar19 = field_parser;
        pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar20,3);
        if (pFVar11 == (FieldDescriptor *)0x0) {
          pUVar12 = field_parser->unknown_;
          if (pUVar12 == (UnknownFieldSet *)0x0) {
            pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_)
            ;
            field_parser->unknown_ = pUVar12;
          }
          pcVar17 = UnknownFieldParse((ulong)(uVar21 & 0xfffffff8 | 3),pUVar12,(char *)puVar18,ctx);
          uVar16 = extraout_RDX_05;
        }
        else {
          pMVar10 = GetGroup((int)pRVar19,pFVar11,field_parser->msg_,field_parser->reflection_);
          iVar9 = ctx->depth_;
          uVar8 = iVar9 - 1;
          uVar16 = (ulong)uVar8;
          ctx->depth_ = uVar8;
          if (iVar9 < 1) {
            pcVar17 = (char *)0x0;
          }
          else {
            ctx->group_depth_ = ctx->group_depth_ + 1;
            iVar9 = (*(pMVar10->super_MessageLite)._vptr_MessageLite[0xd])(pMVar10,puVar18,ctx);
            pcVar17 = (char *)CONCAT44(extraout_var,iVar9);
            uVar1 = ctx->depth_;
            uVar3 = ctx->group_depth_;
            ctx->depth_ = uVar1 + 1;
            ctx->group_depth_ = uVar3 + -1;
            uVar20 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
            uVar16 = extraout_RDX_01;
            if (uVar20 != (uVar21 & 0xfffffff8 | 3)) {
              pcVar17 = (char *)0x0;
            }
          }
        }
      }
LAB_0029d8d1:
      pVar24.second = uVar16;
      pVar24.first = pcVar17;
      if (pcVar17 == (char *)0x0) {
LAB_0029d5b4:
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar16;
        pVar24 = (pair<const_char_*,_unsigned_long>)(auVar6 << 0x40);
      }
      break;
    case 4:
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/parse_context.h"
                 ,0x2b7);
      other = LogMessage::operator<<(&local_68,"Can\'t happen");
      LogFinisher::operator=(&local_71,other);
      LogMessage::~LogMessage(&local_68);
      pVar24.second = extraout_RDX;
      break;
    case 5:
      uVar7 = *puVar18;
      value = (uint64)(uint)uVar7;
      puVar18 = (uint64 *)((long)puVar18 + 4);
      pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar20,5);
      if (pFVar11 != (FieldDescriptor *)0x0) goto LAB_0029d96c;
      pUVar12 = field_parser->unknown_;
      if (pUVar12 == (UnknownFieldSet *)0x0) {
        pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_);
        field_parser->unknown_ = pUVar12;
      }
      UnknownFieldSet::AddFixed32(pUVar12,uVar20,(uint)uVar7);
      pVar24.second = extraout_RDX_03;
      pVar24.first = (char *)puVar18;
    }
    bVar22 = pVar24.first != (char *)0x0;
    psVar13 = (string *)(ulong)bVar22;
    if (!bVar22) {
      unaff_R12 = (uint64 *)0x0;
    }
LAB_0029d5c0:
    if ((char)psVar13 == '\0') {
      return (char *)unaff_R12;
    }
  } while( true );
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* WireFormatParser(T& field_parser,
                                                      const char* ptr,
                                                      ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32 tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}